

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_us * stbi_load_16_from_memory
                    (stbi_uc *buffer,int len,int *x,int *y,int *channels_in_file,
                    int desired_channels)

{
  stbi__uint16 *psVar1;
  int in_ESI;
  stbi_uc *in_RDI;
  stbi__context s;
  int in_stack_ffffffffffffff2c;
  int *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  stbi__context *in_stack_ffffffffffffff48;
  
  stbi__start_mem((stbi__context *)&stack0xfffffffffffffef0,in_RDI,in_ESI);
  psVar1 = stbi__load_and_postprocess_16bit
                     (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                      in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  return psVar1;
}

Assistant:

STBIDEF stbi_us *stbi_load_16_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *channels_in_file, int desired_channels)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__load_and_postprocess_16bit(&s,x,y,channels_in_file,desired_channels);
}